

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.h
# Opt level: O0

void __thiscall gui::TextBoxStyle::~TextBoxStyle(TextBoxStyle *this)

{
  TextBoxStyle *in_RDI;
  
  ~TextBoxStyle(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~TextBoxStyle() = default;